

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O3

int __thiscall
QInternalMessageLogContext::initFrom
          (QInternalMessageLogContext *this,QMessageLogContext *logContext)

{
  Type *pTVar1;
  int iVar2;
  QInternalMessageLogContext *this_00;
  
  (this->super_QMessageLogContext).version = 3;
  this_00 = this;
  QMessageLogContext::copyContextFrom(&this->super_QMessageLogContext,logContext);
  iVar2 = 0;
  if ((this->backtrace).super__Optional_base<QVarLengthArray<void_*,_32LL>,_false,_false>._M_payload
      .super__Optional_payload<QVarLengthArray<void_*,_32LL>,_true,_false,_false>.
      super__Optional_payload_base<QVarLengthArray<void_*,_32LL>_>._M_engaged == false) {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
             operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                         *)this_00);
    iVar2 = 0;
    if (pTVar1 != (Type *)0x0) {
      iVar2 = pTVar1->maxBacktraceDepth;
    }
  }
  return iVar2;
}

Assistant:

int QInternalMessageLogContext::initFrom(const QMessageLogContext &logContext)
{
    version = CurrentVersion + 1;
    copyContextFrom(logContext);

#ifdef QLOGGING_HAVE_BACKTRACE
    if (backtrace.has_value())
        return 0;       // we have a stored backtrace, no need to get it again

    // initializes the message pattern, if needed
    if (auto pattern = qMessagePattern())
        return pattern->maxBacktraceDepth;
#endif

    return 0;
}